

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,
          TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *o)

{
  hash_t size;
  
  this->NumUsed = 0;
  ClearNodeVector(this);
  size = CountUsed(o);
  SetNodeVector(this,size);
  CopyNodes(this,o->Nodes,o->Size);
  return this;
}

Assistant:

TMap &operator= (const TMap &o)
	{
		NumUsed = 0;
		ClearNodeVector();
		SetNodeVector(o.CountUsed());
		CopyNodes(o.Nodes, o.Size);
		return *this;
	}